

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find(StringPiece *this,StringPiece s,size_type pos)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  
  uVar1 = this->length_;
  if ((long)uVar1 < 1 || uVar1 < pos) {
    lVar3 = -(ulong)((uVar1 != 0 || pos != 0) || s.length_ != 0);
  }
  else {
    pcVar2 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (this->ptr_ + pos,this->ptr_ + uVar1,s.ptr_,s.ptr_ + s.length_);
    lVar3 = -1;
    if (pcVar2 != this->ptr_ + this->length_) {
      lVar3 = (long)pcVar2 - (long)this->ptr_;
    }
  }
  return lVar3;
}

Assistant:

stringpiece_ssize_type StringPiece::find(StringPiece s, size_type pos) const {
  if (length_ <= 0 || pos > static_cast<size_type>(length_)) {
    if (length_ == 0 && pos == 0 && s.length_ == 0) return 0;
    return npos;
  }
  const char *result = std::search(ptr_ + pos, ptr_ + length_,
                                   s.ptr_, s.ptr_ + s.length_);
  return result == ptr_ + length_ ? npos : result - ptr_;
}